

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_finish_param_declare
          (irGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paramsName)

{
  uint32_t sourceId;
  element_type *peVar1;
  ulong uVar2;
  size_type sVar3;
  mapped_type *dest;
  mapped_type *pmVar4;
  long in_RDI;
  Variable saveVar;
  Variable *variable;
  int i;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_> *params
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  mapped_type *in_stack_fffffffffffffe80;
  reference in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  mapped_type in_stack_fffffffffffffe94;
  key_type *in_stack_fffffffffffffe98;
  mapped_type *in_stack_fffffffffffffea0;
  key_type *in_stack_fffffffffffffeb8;
  mapped_type *in_stack_fffffffffffffec0;
  long in_stack_fffffffffffffed0;
  uint32_t id;
  irGenerator *in_stack_fffffffffffffed8;
  Variable *in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  irGenerator *in_stack_ffffffffffffff20;
  string local_d8 [72];
  string local_90 [100];
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffe80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
        *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  peVar1 = std::
           __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x26022e);
  iVar5 = 0;
  while( true ) {
    id = (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    uVar2 = (ulong)iVar5;
    sVar3 = std::
            vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
            ::size(&peVar1->params);
    if (sVar3 <= uVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffe80);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
    ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    sourceId = iVar5 + 1;
    dest = std::
           map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
           ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 *)in_stack_fffffffffffffea0,(key_type_conflict *)in_stack_fffffffffffffe98);
    std::shared_ptr<mir::types::Ty>::shared_ptr
              ((shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffe80,
               (shared_ptr<mir::types::Ty> *)in_stack_fffffffffffffe78);
    mir::inst::Variable::Variable
              ((Variable *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (SharedTyPtr *)in_stack_fffffffffffffe88,
               SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffe80 >> 0x30,0),
               SUB81((ulong)in_stack_fffffffffffffe80 >> 0x28,0));
    std::shared_ptr<mir::types::Ty>::~shared_ptr((shared_ptr<mir::types::Ty> *)0x260321);
    getGenSaveParamVarName_abi_cxx11_(in_stack_fffffffffffffed8,id);
    in_stack_fffffffffffffed0 = in_RDI + 0x210;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffed8 =
         (irGenerator *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                       *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    *(int *)((long)&(in_stack_fffffffffffffed8->_package).global_values._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_parent + 4) =
         *(int *)((long)&(in_stack_fffffffffffffed8->_package).global_values._M_t._M_impl.
                         super__Rb_tree_header._M_header._M_parent + 4) + 1;
    insertLocalValue(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                     in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_90);
    getGenSaveParamVarName_abi_cxx11_
              (in_stack_fffffffffffffed8,(uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
              ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    ir_assign((irGenerator *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),(LeftVal *)dest,sourceId);
    std::
    variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x260416);
    std::__cxx11::string::~string(local_d8);
    in_stack_fffffffffffffeb8 = (key_type *)(in_RDI + 0x210);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffec0 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                       *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    getGenSaveParamVarName_abi_cxx11_
              (in_stack_fffffffffffffed8,(uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&in_stack_fffffffffffffec0->_localValueNameToId,in_stack_fffffffffffffeb8)
    ;
    in_stack_fffffffffffffe94 = *pmVar4;
    in_stack_fffffffffffffe98 = (key_type *)(in_RDI + 0x210);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe80 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                       *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffea0 = in_stack_fffffffffffffe80;
    in_stack_fffffffffffffe88 =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe78 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::operator[](&in_stack_fffffffffffffec0->_localValueNameToId,in_stack_fffffffffffffeb8);
    *(mapped_type *)in_stack_fffffffffffffe78 = in_stack_fffffffffffffe94;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
    mir::inst::Variable::~Variable((Variable *)0x26053c);
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void irGenerator::ir_finish_param_declare(std::vector<string> &paramsName) {
  std::vector<SharedTyPtr> &params =
      _package.functions.at(_funcStack.back()).type->params;

  for (int i = 0; i < params.size(); i++) {
    Variable &variable =
        _package.functions.at(_funcStack.back()).variables.at(i + 1);
    Variable saveVar(variable.ty, variable.is_memory_var, variable.is_temp_var);
    insertLocalValue(getGenSaveParamVarName(i + 1),
                     _funcNameToFuncData[_funcStack.back()]._nowLocalValueId++,
                     saveVar);
    ir_assign(getGenSaveParamVarName(i + 1), i + 1);
    _funcNameToFuncData[_funcStack.back()]
        ._localValueNameToId[paramsName.at(i)] =
        _funcNameToFuncData[_funcStack.back()]
            ._localValueNameToId[getGenSaveParamVarName(i + 1)];
  }
}